

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_decoder.h
# Opt level: O0

exr_result_t
LossyDctDecoder_construct
          (LossyDctDecoder *d,DctCoderChannelData *rowPtrs,uint8_t *packedAc,uint8_t *packedAcEnd,
          uint8_t *packedDc,uint64_t remDcCount,uint16_t *toLinear,int width,int height)

{
  exr_result_t eVar1;
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  DctCoderChannelData *in_RSI;
  LossyDctDecoder *in_RDI;
  uint8_t *in_R8;
  uint64_t in_R9;
  uint16_t *in_stack_00000008;
  int in_stack_00000010;
  exr_result_t rv;
  
  eVar1 = LossyDctDecoder_base_construct
                    (in_RDI,in_RDX,in_RCX,in_R8,in_R9,in_stack_00000008,in_stack_00000010,
                     (int)remDcCount);
  in_RDI->_channel_decode_data[0] = in_RSI;
  in_RDI->_channel_decode_data_count = 1;
  return eVar1;
}

Assistant:

exr_result_t
LossyDctDecoder_construct (
    LossyDctDecoder*     d,
    DctCoderChannelData* rowPtrs,
    uint8_t*             packedAc,
    uint8_t*             packedAcEnd,
    uint8_t*             packedDc,
    uint64_t             remDcCount,
    const uint16_t*      toLinear,
    int                  width,
    int                  height)
{
    exr_result_t rv;
    //
    // toLinear is a half-float LUT to convert the encoded values
    // back to linear light. If you want to skip this step, pass
    // in NULL here.
    //

    rv = LossyDctDecoder_base_construct (
        d,
        packedAc,
        packedAcEnd,
        packedDc,
        remDcCount,
        toLinear,
        width,
        height);

    d->_channel_decode_data[0]    = rowPtrs;
    d->_channel_decode_data_count = 1;

    return rv;
}